

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

U32 ZSTD_btGetAllMatches_extDict_5
              (ZSTD_match_t *matches,ZSTD_matchState_t *ms,U32 *nextToUpdate3,BYTE *ip,
              BYTE *iHighLimit,U32 *rep,U32 ll0,U32 lengthToBeat)

{
  ulong *puVar1;
  ulong *puVar2;
  BYTE *__s1;
  uint uVar3;
  BYTE *pBVar4;
  long lVar5;
  U32 lowestValid;
  U32 UVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  size_t sVar12;
  ulong uVar13;
  ulong *puVar14;
  uint *puVar15;
  uint uVar16;
  long lVar17;
  uint uVar18;
  uint uVar19;
  long lVar20;
  ulong *puVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  uint uVar30;
  BYTE *__s1_00;
  BYTE *pInLoopLimit;
  uint *local_100;
  uint local_f8;
  uint *local_d0;
  ulong local_c8;
  uint local_7c;
  ZSTD_matchState_t *local_78;
  ulong *local_70;
  ulong *local_68;
  BYTE *local_60;
  BYTE *local_58;
  BYTE *local_50;
  ZSTD_match_t *local_48;
  U32 *local_40;
  U32 *local_38;
  
  local_48 = matches;
  if ((ms->cParams).minMatch != 5) {
    __assert_fail("BOUNDED(3, ms->cParams.minMatch, 6) == mls",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x8263,
                  "U32 ZSTD_btGetAllMatches_internal(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *, const BYTE *const, const U32 *, const U32, const U32, const ZSTD_dictMode_e, const U32)"
                 );
  }
  pBVar4 = (ms->window).base;
  uVar26 = (ulong)ms->nextToUpdate;
  UVar6 = 0;
  if (pBVar4 + uVar26 <= ip) {
    local_78 = ms;
    while( true ) {
      uVar30 = (uint)uVar26;
      uVar7 = (uint)((long)ip - (long)pBVar4);
      if (uVar7 <= uVar30) break;
      UVar6 = ZSTD_insertBt1(ms,pBVar4 + uVar26,iHighLimit,uVar7,5,1);
      uVar26 = (ulong)(UVar6 + uVar30);
      if (UVar6 + uVar30 <= uVar30) {
        __assert_fail("idx < (U32)(idx + forward)",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x815a,
                      "void ZSTD_updateTree_internal(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const ZSTD_dictMode_e)"
                     );
      }
    }
    if ((ulong)((long)ip - (long)pBVar4) >> 0x20 != 0) {
      __assert_fail("(size_t)(ip - base) <= (size_t)(U32)(-1)",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x815d,
                    "void ZSTD_updateTree_internal(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const ZSTD_dictMode_e)"
                   );
    }
    if ((ulong)((long)iHighLimit - (long)pBVar4) >> 0x20 != 0) {
      __assert_fail("(size_t)(iend - base) <= (size_t)(U32)(-1)",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x815e,
                    "void ZSTD_updateTree_internal(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const ZSTD_dictMode_e)"
                   );
    }
    ms->nextToUpdate = uVar7;
    uVar7 = (ms->cParams).targetLength;
    uVar30 = 0xfff;
    if (uVar7 < 0xfff) {
      uVar30 = uVar7;
    }
    uVar7 = (ms->cParams).hashLog;
    if (0x20 < uVar7) {
      __assert_fail("hBits <= 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x4730,"size_t ZSTD_hashPtr(const void *, U32, U32)");
    }
    uVar26 = (ulong)(*(long *)ip * -0x30e4432345000000) >> (-(char)uVar7 & 0x3fU);
    pBVar4 = (ms->window).base;
    uVar25 = (int)ip - (int)pBVar4;
    uVar23 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
    uVar29 = 0;
    uVar7 = uVar25 - uVar23;
    if (uVar25 < uVar23) {
      uVar7 = 0;
    }
    uVar8 = (ms->window).lowLimit;
    uVar18 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
    uVar22 = uVar25 - uVar18;
    if (uVar25 - uVar8 <= uVar18) {
      uVar22 = uVar8;
    }
    if (ms->loadedDictEnd != 0) {
      uVar22 = uVar8;
    }
    uVar8 = uVar22 + (uVar22 == 0);
    uVar18 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
    if (1 < ll0) {
      __assert_fail("ll0 <= 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x819e,
                    "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                   );
    }
    local_40 = ms->hashTable;
    uVar24 = local_40[uVar26];
    local_38 = ms->chainTable;
    local_50 = (ms->window).dictBase;
    uVar3 = (ms->window).dictLimit;
    uVar27 = (ulong)uVar3;
    local_58 = local_50 + uVar27;
    local_60 = pBVar4 + uVar27;
    uVar10 = (ulong)((uVar23 & uVar25) * 2);
    local_d0 = local_38 + uVar10;
    local_100 = local_38 + uVar10 + 1;
    local_f8 = uVar25 + 9;
    uVar10 = (ulong)(lengthToBeat - 1);
    puVar1 = (ulong *)(ip + 4);
    puVar2 = (ulong *)(iHighLimit + -7);
    local_68 = (ulong *)(iHighLimit + -3);
    local_70 = (ulong *)(iHighLimit + -1);
    uVar28 = (ulong)ll0;
    do {
      if (uVar28 == 3) {
        uVar16 = *rep - 1;
      }
      else {
        uVar16 = rep[uVar28];
      }
      if (uVar25 < uVar3) {
        __assert_fail("curr >= dictLimit",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x81a5,
                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                     );
      }
      uVar19 = uVar25 - uVar16;
      if (uVar16 - 1 < uVar25 - uVar3) {
        uVar13 = 0;
        if ((uVar22 <= uVar19) && (*(int *)ip == *(int *)(ip + -(ulong)uVar16))) {
          lVar20 = -(ulong)uVar16;
          puVar21 = (ulong *)((long)puVar1 + lVar20);
          puVar14 = puVar1;
          if (puVar1 < puVar2) {
            if (*puVar21 == *puVar1) {
              lVar20 = lVar20 + 0xc;
              lVar17 = 0;
              do {
                puVar14 = (ulong *)(ip + lVar17 + 0xc);
                if (puVar2 <= puVar14) {
                  puVar21 = (ulong *)(ip + lVar17 + lVar20);
                  goto LAB_001cdcd5;
                }
                lVar5 = lVar17 + lVar20;
                lVar17 = lVar17 + 8;
              } while (*(ulong *)(ip + lVar5) == *puVar14);
              uVar11 = *puVar14 ^ *(ulong *)(ip + lVar5);
              uVar13 = 0;
              if (uVar11 != 0) {
                for (; (uVar11 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
                }
              }
              uVar16 = ((uint)(uVar13 >> 3) & 0x1fffffff) + (int)lVar17;
            }
            else {
              uVar11 = *puVar1 ^ *puVar21;
              uVar13 = 0;
              if (uVar11 != 0) {
                for (; (uVar11 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
                }
              }
              uVar16 = (uint)(uVar13 >> 3) & 0x1fffffff;
            }
          }
          else {
LAB_001cdcd5:
            if ((puVar14 < local_68) && ((int)*puVar21 == (int)*puVar14)) {
              puVar14 = (ulong *)((long)puVar14 + 4);
              puVar21 = (ulong *)((long)puVar21 + 4);
            }
            if ((puVar14 < local_70) && ((short)*puVar21 == (short)*puVar14)) {
              puVar14 = (ulong *)((long)puVar14 + 2);
              puVar21 = (ulong *)((long)puVar21 + 2);
            }
            if (puVar14 < iHighLimit) {
              puVar14 = (ulong *)((long)puVar14 + (ulong)((BYTE)*puVar21 == (BYTE)*puVar14));
            }
            uVar16 = (int)puVar14 - (int)puVar1;
          }
LAB_001cdd1d:
          uVar13 = (ulong)(uVar16 + 4);
        }
      }
      else {
        if (uVar25 < uVar22) {
          __assert_fail("curr >= windowLow",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x81b1,
                        "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                       );
        }
        uVar13 = 0;
        if (((uVar16 - 1 < uVar25 - uVar22) && (uVar19 - uVar3 < 0xfffffffd)) &&
           (*(int *)ip == *(int *)(local_50 + uVar19))) {
          sVar12 = ZSTD_count_2segments
                             ((BYTE *)puVar1,(BYTE *)((long)(local_50 + uVar19) + 4),iHighLimit,
                              local_58,local_60);
          uVar16 = (uint)sVar12;
          goto LAB_001cdd1d;
        }
      }
      if (uVar10 < uVar13) {
        local_48[uVar29].off = ((int)uVar28 - ll0) + 1;
        local_48[uVar29].len = (uint)uVar13;
        uVar16 = (int)uVar29 + 1;
        uVar29 = (ulong)uVar16;
        if (uVar30 < (uint)uVar13) {
          return uVar16;
        }
        uVar10 = uVar13;
        if (ip + uVar13 == iHighLimit) {
          return uVar16;
        }
      }
      UVar6 = (U32)uVar29;
      uVar28 = uVar28 + 1;
    } while (ll0 + 3 != (int)uVar28);
    local_40[uVar26] = uVar25;
    if (uVar8 <= uVar24) {
      local_c8 = 0;
      uVar26 = 0;
      do {
        uVar28 = uVar26;
        if (local_c8 < uVar26) {
          uVar28 = local_c8;
        }
        if (uVar25 <= uVar24) {
          __assert_fail("curr > matchIndex",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x81f1,
                        "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                       );
        }
        uVar11 = (ulong)uVar24;
        uVar13 = uVar11 + uVar28;
        if (uVar13 < uVar27) {
          __s1 = local_50 + uVar11;
          iVar9 = bcmp(__s1,ip,uVar28);
          if (iVar9 != 0) {
            __assert_fail("memcmp(match, ip, matchLength) == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x81fa,
                          "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                         );
          }
          sVar12 = ZSTD_count_2segments(ip + uVar28,__s1 + uVar28,iHighLimit,local_58,local_60);
          uVar28 = sVar12 + uVar28;
          __s1_00 = pBVar4 + uVar11;
          if (uVar28 + uVar11 < uVar27) {
            __s1_00 = __s1;
          }
        }
        else {
          __s1_00 = pBVar4 + uVar11;
          if ((uVar3 <= uVar24) && (iVar9 = bcmp(__s1_00,ip,uVar28), iVar9 != 0)) {
            __assert_fail("memcmp(match, ip, matchLength) == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x81f6,
                          "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                         );
          }
          puVar1 = (ulong *)(ip + uVar28);
          puVar21 = (ulong *)(__s1_00 + uVar28);
          puVar14 = puVar1;
          if (puVar1 < puVar2) {
            if (*puVar21 == *puVar1) {
              lVar20 = 0;
              do {
                puVar14 = (ulong *)(ip + lVar20 + uVar28 + 8);
                if (puVar2 <= puVar14) {
                  puVar21 = (ulong *)(pBVar4 + uVar13 + lVar20 + 8);
                  goto LAB_001cdf96;
                }
                lVar17 = lVar20 + uVar13 + 8;
                lVar20 = lVar20 + 8;
              } while (*(ulong *)(pBVar4 + lVar17) == *puVar14);
              uVar11 = *puVar14 ^ *(ulong *)(pBVar4 + lVar17);
              uVar13 = 0;
              if (uVar11 != 0) {
                for (; (uVar11 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
                }
              }
              uVar13 = (uVar13 >> 3 & 0x1fffffff) + lVar20;
            }
            else {
              uVar11 = *puVar1 ^ *puVar21;
              uVar13 = 0;
              if (uVar11 != 0) {
                for (; (uVar11 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
                }
              }
              uVar13 = uVar13 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_001cdf96:
            if ((puVar14 < local_68) && ((int)*puVar21 == (int)*puVar14)) {
              puVar14 = (ulong *)((long)puVar14 + 4);
              puVar21 = (ulong *)((long)puVar21 + 4);
            }
            if ((puVar14 < local_70) && ((short)*puVar21 == (short)*puVar14)) {
              puVar14 = (ulong *)((long)puVar14 + 2);
              puVar21 = (ulong *)((long)puVar21 + 2);
            }
            if (puVar14 < iHighLimit) {
              puVar14 = (ulong *)((long)puVar14 + (ulong)((BYTE)*puVar21 == (BYTE)*puVar14));
            }
            uVar13 = (long)puVar14 - (long)puVar1;
          }
          uVar28 = uVar13 + uVar28;
        }
        if (uVar10 < uVar28) {
          if (local_f8 < uVar24 || local_f8 - uVar24 == 0) {
            __assert_fail("matchEndIdx > matchIndex",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x8203,
                          "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                         );
          }
          if (local_f8 - uVar24 < uVar28) {
            local_f8 = uVar24 + (U32)uVar28;
          }
          local_48[uVar29].off = (uVar25 + 3) - uVar24;
          local_48[uVar29].len = (U32)uVar28;
          UVar6 = (int)uVar29 + 1;
          uVar29 = (ulong)UVar6;
          if ((0x1000 < uVar28) || (uVar10 = uVar28, ip + uVar28 == iHighLimit)) break;
        }
        UVar6 = (U32)uVar29;
        puVar15 = local_38 + (uVar24 & uVar23) * 2;
        if (__s1_00[uVar28] < ip[uVar28]) {
          *local_d0 = uVar24;
          if (uVar24 <= uVar7) {
            local_d0 = &local_7c;
            break;
          }
          puVar15 = puVar15 + 1;
          local_d0 = puVar15;
          local_c8 = uVar28;
        }
        else {
          *local_100 = uVar24;
          local_100 = puVar15;
          uVar26 = uVar28;
          if (uVar24 <= uVar7) {
            local_100 = &local_7c;
            break;
          }
        }
        uVar18 = uVar18 - 1;
        if ((uVar18 == 0) || (uVar24 = *puVar15, uVar24 < uVar8)) break;
      } while( true );
    }
    *local_100 = 0;
    *local_d0 = 0;
    if (0x40000000 < uVar18) {
      __assert_fail("nbCompares <= (1U << ZSTD_SEARCHLOG_MAX)",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x8221,
                    "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                   );
    }
    if (local_f8 <= uVar25 + 8) {
      __assert_fail("matchEndIdx > curr+8",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x8248,
                    "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                   );
    }
    local_78->nextToUpdate = local_f8 - 8;
  }
  return UVar6;
}

Assistant:

GEN_ZSTD_BT_GET_ALL_MATCHES(noDict)
GEN_ZSTD_BT_GET_ALL_MATCHES(extDict)
GEN_ZSTD_BT_GET_ALL_MATCHES(dictMatchState)

#define ZSTD_BT_GET_ALL_MATCHES_ARRAY(dictMode)  \
    {                                            \
        ZSTD_BT_GET_ALL_MATCHES_FN(dictMode, 3), \
        ZSTD_BT_GET_ALL_MATCHES_FN(dictMode, 4), \
        ZSTD_BT_GET_ALL_MATCHES_FN(dictMode, 5), \
        ZSTD_BT_GET_ALL_MATCHES_FN(dictMode, 6)  \
    }

static ZSTD_getAllMatchesFn
ZSTD_selectBtGetAllMatches(ZSTD_matchState_t const* ms, ZSTD_dictMode_e const dictMode)
{
    ZSTD_getAllMatchesFn const getAllMatchesFns[3][4] = {
        ZSTD_BT_GET_ALL_MATCHES_ARRAY(noDict),
        ZSTD_BT_GET_ALL_MATCHES_ARRAY(extDict),
        ZSTD_BT_GET_ALL_MATCHES_ARRAY(dictMatchState)
    };
    U32 const mls = BOUNDED(3, ms->cParams.minMatch, 6);
    assert((U32)dictMode < 3);
    assert(mls - 3 < 4);
    return getAllMatchesFns[(int)dictMode][mls - 3];
}

/*************************
*  LDM helper functions  *
*************************/

/* Struct containing info needed to make decision about ldm inclusion */
typedef struct {
    rawSeqStore_t seqStore;   /* External match candidates store for this block */
    U32 startPosInBlock;      /* Start position of the current match candidate */
    U32 endPosInBlock;        /* End position of the current match candidate */
    U32 offset;               /* Offset of the match candidate */
} ZSTD_optLdm_t;

/* ZSTD_optLdm_skipRawSeqStoreBytes():
 * Moves forward in @rawSeqStore by @nbBytes,
 * which will update the fields 'pos' and 'posInSequence'.
 */
static void ZSTD_optLdm_skipRawSeqStoreBytes(rawSeqStore_t* rawSeqStore, size_t nbBytes)
{
    U32 currPos = (U32)(rawSeqStore->posInSequence + nbBytes);
    while (currPos && rawSeqStore->pos < rawSeqStore->size) {
        rawSeq currSeq = rawSeqStore->seq[rawSeqStore->pos];
        if (currPos >= currSeq.litLength + currSeq.matchLength) {
            currPos -= currSeq.litLength + currSeq.matchLength;
            rawSeqStore->pos++;
        } else {
            rawSeqStore->posInSequence = currPos;
            break;
        }
    }
    if (currPos == 0 || rawSeqStore->pos == rawSeqStore->size) {
        rawSeqStore->posInSequence = 0;
    }
}